

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall Nova::Driver<float,_1>::Initialize(Driver<float,_1> *this)

{
  Example<float,_1> *pEVar1;
  int iVar2;
  int iVar3;
  
  pEVar1 = this->example;
  if (pEVar1->restart == true) {
    this->current_frame = pEVar1->restart_frame;
    (*this->_vptr_Driver[6])(this);
    iVar2 = this->current_frame;
    pEVar1 = this->example;
    iVar3 = pEVar1->first_frame;
  }
  else {
    iVar2 = pEVar1->first_frame;
    this->current_frame = iVar2;
    iVar3 = iVar2;
  }
  this->output_number = iVar2;
  this->time = (float)(iVar2 - iVar3) / pEVar1->frame_rate + pEVar1->initial_time;
  pEVar1->output_number = iVar2;
  pEVar1->current_frame = iVar2;
  return;
}

Assistant:

void Driver<T,d>::
Initialize()
{
    if(example.restart){current_frame=example.restart_frame;Read_Time(current_frame);}
    else current_frame=example.first_frame;
    output_number=current_frame;
    time=example.Time_At_Frame(current_frame);
    example.output_number=output_number;
    example.current_frame=current_frame;
}